

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O3

FxExpression * __thiscall FxMinusSign::Resolve(FxMinusSign *this,FCompileContext *ctx)

{
  PString *pPVar1;
  PInt *pPVar2;
  PFloat *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  FxExpression *pFVar5;
  TArray<FxJumpStatement_*,_FxJumpStatement_*> *other;
  ExpVal val;
  FString local_40;
  FxJumpStatement **local_38;
  undefined8 uStack_30;
  
  if ((this->super_FxExpression).isresolved == false) {
    (this->super_FxExpression).isresolved = true;
    if (this->Operand != (FxExpression *)0x0) {
      iVar4 = (*this->Operand->_vptr_FxExpression[2])();
      pFVar5 = (FxExpression *)CONCAT44(extraout_var,iVar4);
      this->Operand = pFVar5;
      if (pFVar5 != (FxExpression *)0x0) {
        if ((pFVar5->ValueType == (PType *)TypeName) ||
           ((iVar4 = (**(code **)(*(long *)&pFVar5->ValueType->super_DObject + 0x90))(), iVar4 != 0
            && (iVar4 = (*(pFVar5->ValueType->super_DObject)._vptr_DObject[0x12])(), iVar4 != 1))))
        {
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,2,"Numeric type expected");
          (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
          return (FxExpression *)0x0;
        }
        iVar4 = (*this->Operand->_vptr_FxExpression[3])();
        if ((char)iVar4 == '\0') {
          (this->super_FxExpression).ValueType = this->Operand->ValueType;
          return &this->super_FxExpression;
        }
        pPVar1 = (PString *)this->Operand[1]._vptr_FxExpression;
        other = &this->Operand[1].JumpAddresses;
        if (pPVar1 == TypeString) {
          FString::AttachToOther(&local_40,(FString *)other);
        }
        else {
          local_40.Chars = (char *)other->Array;
        }
        iVar4 = (*(pPVar1->super_PBasicType).super_PType.super_DObject._vptr_DObject[0x12])();
        if (iVar4 == 0) {
          pFVar5 = (FxExpression *)operator_new(0x48);
          iVar4 = (int)local_40.Chars;
          FxExpression::FxExpression(pFVar5,&(this->super_FxExpression).ScriptPosition);
          pFVar5->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_0088f2f0;
          pPVar2 = TypeSInt32;
          *(PInt **)(pFVar5 + 1) = TypeSInt32;
          pFVar5->ValueType = (PType *)pPVar2;
          *(int *)&pFVar5[1].JumpAddresses.Array = -iVar4;
        }
        else {
          pFVar5 = (FxExpression *)operator_new(0x48);
          local_38 = (FxJumpStatement **)local_40.Chars;
          uStack_30 = 0;
          FxExpression::FxExpression(pFVar5,&(this->super_FxExpression).ScriptPosition);
          pFVar5->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_0088f2f0;
          pPVar3 = TypeFloat64;
          *(PFloat **)(pFVar5 + 1) = TypeFloat64;
          pFVar5->ValueType = (PType *)pPVar3;
          pFVar5[1].JumpAddresses.Array = (FxJumpStatement **)((ulong)local_38 ^ 0x8000000000000000)
          ;
        }
        pFVar5->isresolved = true;
        (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
        if (pPVar1 != TypeString) {
          return pFVar5;
        }
        FString::~FString(&local_40);
        return pFVar5;
      }
    }
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    this = (FxMinusSign *)0x0;
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxMinusSign::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Operand, ctx);

	if (Operand->IsNumeric())
	{
		if (Operand->isConstant())
		{
			ExpVal val = static_cast<FxConstant *>(Operand)->GetValue();
			FxExpression *e = val.Type->GetRegType() == REGT_INT ?
				new FxConstant(-val.Int, ScriptPosition) :
				new FxConstant(-val.Float, ScriptPosition);
			delete this;
			return e;
		}
		ValueType = Operand->ValueType;
		return this;
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Numeric type expected");
		delete this;
		return NULL;
	}
}